

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

size_t __thiscall features::Sift::extrema_detection(Sift *this,ConstPtr *s,int oi,int si)

{
  pointer *ppKVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  element_type *peVar6;
  iterator __position;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  uint local_78 [2];
  int noff [9];
  Keypoint kp;
  int local_34;
  
  peVar6 = s[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = (peVar6->super_TypedImageBase<float>).super_ImageBase.w;
  iVar5 = (peVar6->super_TypedImageBase<float>).super_ImageBase.h;
  local_78[0] = ~uVar4;
  local_78[1] = -uVar4;
  noff[0] = 1 - uVar4;
  noff[1] = -1;
  noff[2] = 0;
  noff[3] = 1;
  noff[4] = uVar4 - 1;
  noff[5] = uVar4;
  noff[6] = uVar4 + 1;
  sVar12 = 0;
  if (2 < iVar5) {
    local_34 = 0;
    lVar13 = (long)(int)uVar4;
    iVar10 = 1;
    do {
      if (2 < (int)uVar4) {
        uVar9 = 1;
        do {
          fVar2 = ((s[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_TypedImageBase<float>).data.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar9 + lVar13];
          sVar7 = 1;
          bVar14 = true;
          for (uVar8 = 0; ((sVar7 != 0 || (bVar14)) && (uVar8 < 3)); uVar8 = uVar8 + 1) {
            for (uVar11 = 0; ((sVar7 != 0 || (bVar14)) && (uVar11 < 9)); uVar11 = uVar11 + 1) {
              if (uVar11 != 4 || uVar8 != 1) {
                fVar3 = ((s[uVar8].
                          super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_TypedImageBase<float>).data.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [uVar9 + lVar13 + (long)(int)local_78[uVar11]];
                if (fVar2 <= fVar3) {
                  sVar7 = sVar12;
                }
                if (fVar3 <= fVar2) {
                  bVar14 = false;
                }
              }
            }
          }
          if (bVar14 || (char)sVar7 != '\0') {
            __position._M_current =
                 (this->keypoints).
                 super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->keypoints).
                super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              noff[7] = oi;
              noff[8] = (int)(float)si;
              std::vector<features::Sift::Keypoint,std::allocator<features::Sift::Keypoint>>::
              _M_realloc_insert<features::Sift::Keypoint_const&>
                        ((vector<features::Sift::Keypoint,std::allocator<features::Sift::Keypoint>>
                          *)&this->keypoints,__position,(Keypoint *)(noff + 7));
            }
            else {
              (__position._M_current)->octave = oi;
              (__position._M_current)->sample = (float)si;
              (__position._M_current)->x = (float)(int)uVar9;
              (__position._M_current)->y = (float)iVar10;
              ppKVar1 = &(this->keypoints).
                         super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppKVar1 = *ppKVar1 + 1;
            }
            local_34 = local_34 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar4 - 1);
      }
      lVar13 = lVar13 + (int)uVar4;
      bVar14 = iVar10 != iVar5 + -2;
      iVar10 = iVar10 + 1;
    } while (bVar14);
    sVar12 = (size_t)local_34;
  }
  return sVar12;
}

Assistant:

std::size_t
Sift::extrema_detection (core::FloatImage::ConstPtr s[3], int oi, int si)
{
    int const w = s[1]->width();
    int const h = s[1]->height();

    /* Offsets for the 9-neighborhood w.r.t. center pixel. */
    int noff[9] = { -1 - w, 0 - w, 1 - w, -1, 0, 1, -1 + w, 0 + w, 1 + w };

    /*
     * Iterate over all pixels in s[1], and check if pixel is maximum
     * (or minumum) in its 27-neighborhood.
     */
    int detected = 0;
    int off = w;
    for (int y = 1; y < h - 1; ++y, off += w)
        for (int x = 1; x < w - 1; ++x)
        {
            int idx = off + x;

            bool largest = true;
            bool smallest = true;
            float center_value = s[1]->at(idx);
            for (int l = 0; (largest || smallest) && l < 3; ++l)
                for (int i = 0; (largest || smallest) && i < 9; ++i)
                {
                    if (l == 1 && i == 4) // Skip center pixel
                        continue;
                    if (s[l]->at(idx + noff[i]) >= center_value)
                        largest = false;
                    if (s[l]->at(idx + noff[i]) <= center_value)
                        smallest = false;
                }

            /* Skip non-maximum values. */
            if (!smallest && !largest)
                continue;

            /* Yummy. Add detected scale space extremum. */
            Keypoint kp;
            kp.octave = oi;
            kp.x = static_cast<float>(x);
            kp.y = static_cast<float>(y);
            kp.sample = static_cast<float>(si);
            this->keypoints.push_back(kp);
            detected += 1;
        }

    return detected;
}